

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall cmFindLibraryHelper::cmFindLibraryHelper(cmFindLibraryHelper *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  cmGlobalGenerator *pcVar4;
  string *arg;
  string *arg_00;
  cmState *this_00;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  string *local_40;
  string *local_38;
  
  this->Makefile = mf;
  local_38 = &this->PrefixRegexStr;
  local_48 = &(this->PrefixRegexStr).field_2;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PrefixRegexStr)._M_dataplus._M_p = (pointer)local_48;
  (this->PrefixRegexStr)._M_string_length = 0;
  (this->PrefixRegexStr).field_2._M_local_buf[0] = '\0';
  local_40 = &this->SuffixRegexStr;
  local_50 = &(this->SuffixRegexStr).field_2;
  (this->SuffixRegexStr)._M_dataplus._M_p = (pointer)local_50;
  (this->SuffixRegexStr)._M_string_length = 0;
  (this->SuffixRegexStr).field_2._M_local_buf[0] = '\0';
  local_58 = &(this->BestPath).field_2;
  (this->BestPath)._M_dataplus._M_p = (pointer)local_58;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = &(this->TestPath).field_2;
  (this->TestPath)._M_dataplus._M_p = (pointer)local_60;
  (this->TestPath)._M_string_length = 0;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  pcVar4 = cmMakefile::GetGlobalGenerator(mf);
  this->GG = pcVar4;
  pcVar2 = this->Makefile;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CMAKE_FIND_LIBRARY_PREFIXES","");
  arg = cmMakefile::GetRequiredDefinition(pcVar2,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CMAKE_FIND_LIBRARY_SUFFIXES","");
  arg_00 = cmMakefile::GetRequiredDefinition(pcVar2,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  cmSystemTools::ExpandListArgument(arg,&this->Prefixes,true);
  cmSystemTools::ExpandListArgument(arg_00,&this->Suffixes,true);
  RegexFromList(this,local_38,&this->Prefixes);
  RegexFromList(this,local_40,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar3 = cmState::GetGlobalPropertyAsBool(this_00,&local_80);
  this->OpenBSD = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(cmMakefile* mf)
  : Makefile(mf)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  std::string const& prefixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_PREFIXES");
  std::string const& suffixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_SUFFIXES");
  cmSystemTools::ExpandListArgument(prefixes_list, this->Prefixes, true);
  cmSystemTools::ExpandListArgument(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}